

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

HRESULT Js::ParseableFunctionInfo::MapDeferredReparseError
                  (HRESULT *hrParse,CompileScriptException *se)

{
  int iVar1;
  int local_1c;
  HRESULT hrMapped;
  CompileScriptException *se_local;
  HRESULT *hrParse_local;
  
  local_1c = 0;
  if (*hrParse == -0x7ff8fff2) {
    local_1c = -0x7ff8fff2;
  }
  else if (*hrParse == -0x7999bffc) {
    iVar1 = (se->super_ScriptException).ei.scode;
    if (iVar1 == -0x7fffbffc) {
      local_1c = -0x7fffbffc;
    }
    else {
      if ((iVar1 != -0x7ff8fff2) && (iVar1 != -0x7ff5fff9)) {
        if (iVar1 == -0x7ff5ffe4) {
          local_1c = -0x7ff5ffe4;
          goto LAB_00a18bdd;
        }
        if (iVar1 != -0x7ff5fc17) {
          if (iVar1 == -0x7ff5ebe4) {
            local_1c = -0x7ff5ebe4;
          }
          goto LAB_00a18bdd;
        }
      }
      local_1c = -0x7ff8fff2;
    }
  }
LAB_00a18bdd:
  if (local_1c < 0) {
    *hrParse = 0;
  }
  return local_1c;
}

Assistant:

HRESULT ParseableFunctionInfo::MapDeferredReparseError(HRESULT& hrParse, const CompileScriptException& se)
    {
        HRESULT hrMapped = NO_ERROR;

        switch (hrParse)
        {
        case E_OUTOFMEMORY:
            hrMapped = E_OUTOFMEMORY;
            break;

        case SCRIPT_E_RECORDED:
            switch (se.ei.scode)
            {
            case ERRnoMemory:
            case E_OUTOFMEMORY:
            case VBSERR_OutOfMemory:
                hrMapped = E_OUTOFMEMORY;
                break;

            case VBSERR_OutOfStack:
                hrMapped = VBSERR_OutOfStack;
                break;

            case JSERR_AsmJsCompileError:
                hrMapped = JSERR_AsmJsCompileError;
                break;

            case E_ABORT:
                hrMapped = E_ABORT;
                break;
            }
        }

        if (FAILED(hrMapped))
        {
            // If we have mapped error, clear hrParse. We'll throw error from hrMapped.
            hrParse = NO_ERROR;
        }

        return hrMapped;
    }